

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPResponse.cpp
# Opt level: O2

bool __thiscall SNMPResponse::addErrorResponse(SNMPResponse *this,VarBind *response)

{
  deque<VarBind,_std::allocator<VarBind>_> *this_00;
  size_type sVar1;
  
  this_00 = &(this->super_SNMPPacket).varbindList;
  sVar1 = std::deque<VarBind,_std::allocator<VarBind>_>::size(this_00);
  std::deque<VarBind,std::allocator<VarBind>>::emplace_back<VarBind_const&>
            ((deque<VarBind,std::allocator<VarBind>> *)this_00,response);
  if (response->errorStatus != NO_ERROR) {
    (this->super_SNMPPacket).errorStatus.errorStatus = response->errorStatus;
    (this->super_SNMPPacket).errorIndex.errorIndex = (int)sVar1 + 1;
  }
  return true;
}

Assistant:

bool SNMPResponse::addErrorResponse(const VarBind& response){
    int index = this->varbindList.size() + 1;
    this->varbindList.emplace_back(response);
    
    if(response.errorStatus != NO_ERROR){
        this->errorStatus.errorStatus = response.errorStatus;
        this->errorIndex.errorIndex = index;
    }
    return true;
}